

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConeTwistConstraint.cpp
# Opt level: O1

void __thiscall
btConeTwistConstraint::setParam(btConeTwistConstraint *this,int num,btScalar value,int axis)

{
  if (num - 3U < 2) {
    if ((uint)axis < 3) {
      this->m_linCFM = value;
      *(byte *)&this->m_flags = (byte)this->m_flags | 1;
      return;
    }
    this->m_angCFM = value;
    *(byte *)&this->m_flags = (byte)this->m_flags | 4;
  }
  else if (num - 1U < 2) {
    if ((uint)axis < 3) {
      this->m_linERP = value;
      *(byte *)&this->m_flags = (byte)this->m_flags | 2;
      return;
    }
    this->m_biasFactor = value;
    return;
  }
  return;
}

Assistant:

void btConeTwistConstraint::setParam(int num, btScalar value, int axis)
{
	switch(num)
	{
		case BT_CONSTRAINT_ERP :
		case BT_CONSTRAINT_STOP_ERP :
			if((axis >= 0) && (axis < 3)) 
			{
				m_linERP = value;
				m_flags |= BT_CONETWIST_FLAGS_LIN_ERP;
			}
			else
			{
				m_biasFactor = value;
			}
			break;
		case BT_CONSTRAINT_CFM :
		case BT_CONSTRAINT_STOP_CFM :
			if((axis >= 0) && (axis < 3)) 
			{
				m_linCFM = value;
				m_flags |= BT_CONETWIST_FLAGS_LIN_CFM;
			}
			else
			{
				m_angCFM = value;
				m_flags |= BT_CONETWIST_FLAGS_ANG_CFM;
			}
			break;
		default:
			btAssertConstrParams(0);
			break;
	}
}